

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O3

void __thiscall Fl_Widget::deactivate(Fl_Widget *this)

{
  Fl_Widget *o;
  Fl_Group *pFVar1;
  
  pFVar1 = (Fl_Group *)this;
  do {
    if ((*(uint *)((long)&pFVar1->super_Fl_Widget + 0x60) & 1) != 0) {
      *(byte *)&this->flags_ = (byte)this->flags_ | 1;
      return;
    }
    pFVar1 = *(Fl_Group **)((long)&pFVar1->super_Fl_Widget + 8);
  } while (pFVar1 != (Fl_Group *)0x0);
  *(byte *)&this->flags_ = (byte)this->flags_ | 1;
  redraw(this);
  redraw_label(this);
  (*this->_vptr_Fl_Widget[3])(this,0xd);
  fl_throw_focus(this);
  return;
}

Assistant:

void Fl_Widget::deactivate() {
  if (active_r()) {
    set_flag(INACTIVE);
    redraw();
    redraw_label();
    handle(FL_DEACTIVATE);
    fl_throw_focus(this);
  } else {
    set_flag(INACTIVE);
  }
}